

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddBtreeIndex(WhereLoopBuilder *pBuilder,SrcItem *pSrc,Index *pProbe,LogEst nInMul)

{
  long lVar1;
  byte *pbVar2;
  ushort uVar3;
  u16 uVar4;
  u16 uVar5;
  ushort uVar6;
  ushort uVar7;
  LogEst LVar8;
  uint uVar9;
  Parse *pParse;
  sqlite3 *db;
  WhereLoop *p;
  ulong uVar10;
  Expr *pExpr;
  u32 opMask;
  char cVar11;
  char cVar12;
  ushort uVar13;
  LogEst LVar14;
  ushort uVar15;
  short a;
  int iVar16;
  uint uVar17;
  WhereTerm *pWVar18;
  Expr *pEVar19;
  Select *pSVar20;
  CollSeq *pCVar21;
  u8 uVar22;
  short sVar23;
  uint uVar24;
  ulong uVar25;
  u16 uVar26;
  ushort uVar27;
  long lVar28;
  short sVar29;
  u64 x;
  ulong uVar30;
  short sVar31;
  uint uVar32;
  byte bVar33;
  WhereScan scan;
  WhereTerm *local_130;
  uint local_128;
  WhereTerm *local_110;
  uint local_108;
  WhereScan local_a0;
  
  pParse = pBuilder->pWInfo->pParse;
  db = pParse->db;
  iVar16 = 7;
  if (db->mallocFailed == '\0') {
    p = pBuilder->pNew;
    uVar9 = p->wsFlags;
    uVar32 = 0x18;
    if ((uVar9 & 0x20) == 0) {
      uVar32 = 0x1bf;
    }
    opMask = uVar32 & 0xffffff83;
    if ((*(ushort *)&pProbe->field_0x63 & 4) == 0) {
      opMask = uVar32;
    }
    uVar3 = (p->u).btree.nEq;
    uVar25 = (ulong)uVar3;
    uVar4 = (p->u).btree.nBtm;
    uVar5 = (p->u).btree.nTop;
    uVar6 = p->nSkip;
    uVar7 = p->nLTerm;
    uVar10 = p->prereq;
    LVar8 = p->nOut;
    pWVar18 = whereScanInit(&local_a0,pBuilder->pWC,pSrc->iCursor,(uint)uVar3,opMask,pProbe);
    p->rSetup = 0;
    sVar23 = *pProbe->aiRowLogEst;
    iVar16 = 0;
    local_108 = 0;
    if (10 < (long)sVar23) {
      uVar13 = sqlite3LogEst((long)sVar23);
      local_108 = uVar13 - 0x21;
    }
    if (pWVar18 != (WhereTerm *)0x0) {
      local_110 = (WhereTerm *)0x0;
      local_130 = (WhereTerm *)0x0;
LAB_001a67e3:
      uVar13 = pWVar18->eOperator;
      if ((uVar13 != 0x100) && ((pWVar18->wtFlags & 0x80) == 0)) {
LAB_001a6835:
        uVar30 = p->maskSelf;
        iVar16 = 0;
        if (((pWVar18->prereqRight & uVar30) != 0) ||
           ((uVar13 == 0x10 && ((pWVar18->wtFlags & 0x100) != 0)))) goto LAB_001a6e86;
        bVar33 = (pSrc->fg).jointype;
        if ((bVar33 & 0x58) != 0) {
          uVar32 = pWVar18->pExpr->flags;
          if ((((uVar32 & 3) == 0) || ((pWVar18->pExpr->w).iJoin != pSrc->iCursor)) ||
             (((bVar33 & 0x18) != 0 && ((uVar32 & 2) != 0)))) goto LAB_001a6e86;
        }
        local_128 = (uint)uVar3;
        if ((pProbe->onError == '\0') || (bVar33 = 2, pProbe->nKeyCol - 1 != local_128)) {
          bVar33 = 1;
        }
        pBuilder->bldFlags1 = pBuilder->bldFlags1 | bVar33;
        p->wsFlags = uVar9;
        (p->u).btree.nEq = uVar3;
        (p->u).btree.nBtm = uVar4;
        (p->u).btree.nTop = uVar5;
        p->nLTerm = uVar7;
        uVar26 = uVar7;
        if (p->nLSlot <= uVar7) {
          iVar16 = whereLoopResize(db,p,uVar7 + 1);
          if (iVar16 == 0) {
            uVar26 = p->nLTerm;
            uVar30 = p->maskSelf;
            goto LAB_001a6916;
          }
          goto LAB_001a6fc0;
        }
LAB_001a6916:
        uVar27 = uVar26 + 1;
        p->nLTerm = uVar27;
        p->aLTerm[uVar26] = pWVar18;
        p->prereq = ~uVar30 & (pWVar18->prereqRight | uVar10);
        if ((uVar13 & 1) == 0) {
          if ((uVar13 & 0x82) != 0) {
            sVar29 = pProbe->aiColumn[uVar25];
            uVar17 = p->wsFlags;
            uVar32 = uVar17 | 1;
            p->wsFlags = uVar32;
            uVar24 = 0x1001;
            if (sVar29 == -1) {
LAB_001a69b2:
              uVar32 = uVar17 | uVar24;
              p->wsFlags = uVar32;
            }
            else if (((nInMul == 0) && (-1 < sVar29)) && (pProbe->nKeyCol - 1 == local_128)) {
              if (((pProbe->field_0x63 & 8) == 0) &&
                 (((pProbe->nKeyCol != 1 || (uVar13 != 2)) || (pProbe->onError == '\0')))) {
                uVar24 = 0x10001;
              }
              goto LAB_001a69b2;
            }
            uVar17 = 0;
            sVar29 = 0;
            if (1 < local_a0.iEquiv) {
              uVar32 = uVar32 | 0x200000;
              goto LAB_001a6a91;
            }
            goto LAB_001a6a96;
          }
          if ((uVar13 >> 8 & 1) != 0) {
            uVar32 = p->wsFlags | 8;
            p->wsFlags = uVar32;
            sVar29 = 0;
            goto LAB_001a6a96;
          }
          pEVar19 = pWVar18->pExpr->pLeft;
          uVar22 = pEVar19->op;
          if (uVar22 == 0xb0) {
            uVar22 = pEVar19->op2;
          }
          if (uVar22 == 0xb1) {
LAB_001a6b4f:
            uVar32 = ((pEVar19->x).pList)->nExpr;
          }
          else {
            uVar32 = 1;
            if (uVar22 == 0x8a) {
              pEVar19 = (Expr *)(pEVar19->x).pList;
              goto LAB_001a6b4f;
            }
          }
          local_128 = pProbe->nColumn - local_128;
          if ((int)uVar32 < (int)local_128) {
            local_128 = uVar32;
          }
          uVar30 = 1;
          if (1 < (int)local_128) {
            iVar16 = pSrc->iCursor;
            uVar30 = 1;
LAB_001a6b8b:
            pSVar20 = (Select *)pWVar18->pExpr->pRight;
            if ((pSVar20->selFlags & 0x1000) != 0) {
              pSVar20 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar20->pEList)->pSelect;
            }
            pEVar19 = ((pWVar18->pExpr->pLeft->x).pList)->a[uVar30].pExpr;
            if ((((pEVar19->op == 0xa7) && (pEVar19->iTable == iVar16)) &&
                (lVar1 = uVar30 + uVar25, pEVar19->iColumn == pProbe->aiColumn[lVar1])) &&
               (pProbe->aSortOrder[lVar1] == pProbe->aSortOrder[uVar25])) {
              pExpr = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar20->pEList)->pList->a[uVar30].pExpr;
              cVar11 = sqlite3ExprAffinity(pEVar19);
              cVar12 = sqlite3CompareAffinity(pExpr,cVar11);
              sVar29 = pEVar19->iColumn;
              cVar11 = 'D';
              if ((-1 < (long)sVar29) && (sVar29 < pProbe->pTable->nCol)) {
                cVar11 = pProbe->pTable->aCol[sVar29].affinity;
              }
              if ((cVar12 == cVar11) &&
                 (pCVar21 = sqlite3BinaryCompareCollSeq(pParse,pEVar19,pExpr),
                 pCVar21 != (CollSeq *)0x0)) {
                lVar28 = 0;
                do {
                  bVar33 = pCVar21->zName[lVar28];
                  if (bVar33 == pProbe->azColl[lVar1][lVar28]) {
                    if ((ulong)bVar33 == 0) goto LAB_001a6cb3;
                  }
                  else if (""[bVar33] != ""[(byte)pProbe->azColl[lVar1][lVar28]]) break;
                  lVar28 = lVar28 + 1;
                } while( true );
              }
            }
          }
          goto LAB_001a6ed3;
        }
        pEVar19 = pWVar18->pExpr;
        if ((pEVar19->flags & 0x1000) == 0) {
          uVar17 = 0;
          if (((pEVar19->x).pList != (ExprList *)0x0) &&
             (x = (u64)((pEVar19->x).pList)->nExpr, uVar17 = 0, x != 0)) {
            LVar14 = sqlite3LogEst(x);
            uVar17 = (uint)LVar14;
          }
        }
        else {
          uVar17 = 0x2e;
          if (1 < uVar27) {
            uVar32 = 0x2e;
            uVar17 = 0x2e;
            uVar30 = 0;
            do {
              if ((p->aLTerm[uVar30] != (WhereTerm *)0x0) &&
                 (uVar17 = uVar32, p->aLTerm[uVar30]->pExpr == pEVar19)) {
                uVar32 = 0;
                uVar17 = 0;
              }
              uVar30 = uVar30 + 1;
            } while (uVar27 - 1 != uVar30);
          }
        }
        if (((pProbe->field_0x63 & 0x80) != 0) && (9 < (short)local_108)) {
          uVar27 = pProbe->aiRowLogEst[uVar25];
          uVar32 = 0;
          if (10 < (int)uVar17) {
            uVar15 = sqlite3LogEst((ulong)(uVar17 & 0xffff));
            uVar32 = uVar15 - 0x21 & 0xffff;
          }
          if ((short)((short)(((uint)uVar27 - ((local_108 & 0xffff) + uVar17)) + uVar32) + 10) < 0)
          {
            iVar16 = 0;
            if ((1 < nInMul) || ((db->dbOptFlags & 0x20000) != 0)) goto LAB_001a6e86;
            pbVar2 = (byte *)((long)&p->wsFlags + 2);
            *pbVar2 = *pbVar2 | 0x10;
          }
        }
        uVar32 = p->wsFlags | 4;
LAB_001a6a91:
        sVar29 = (short)uVar17;
        p->wsFlags = uVar32;
        goto LAB_001a6a96;
      }
      sVar29 = pProbe->aiColumn[uVar25];
      if ((long)sVar29 < 0) {
        bVar33 = sVar29 == -1;
      }
      else {
        bVar33 = pProbe->pTable->aCol[sVar29].field_0x8 & 0xf;
      }
      iVar16 = 0;
      if (bVar33 == 0) goto LAB_001a6835;
      goto LAB_001a6e86;
    }
LAB_001a6fc3:
    p->prereq = uVar10;
    (p->u).btree.nEq = uVar3;
    (p->u).btree.nBtm = uVar4;
    (p->u).btree.nTop = uVar5;
    p->nSkip = uVar6;
    p->wsFlags = uVar9;
    p->nOut = LVar8;
    p->nLTerm = uVar7;
    if (((uVar3 == uVar6) &&
        (((uVar3 == uVar7 && uVar3 + 1 < (uint)pProbe->nKeyCol &&
          ((*(ushort *)&pProbe->field_0x63 & 0xc0) == 0x80)) && ((db->dbOptFlags & 0x4000) == 0))))
       && ((0x29 < pProbe->aiRowLogEst[uVar25 + 1] &&
           (iVar16 = whereLoopResize(db,p,uVar7 + 1), iVar16 == 0)))) {
      (p->u).btree.nEq = (p->u).btree.nEq + 1;
      uVar32._0_2_ = p->nLTerm;
      uVar32._2_2_ = p->nSkip;
      p->nLTerm = (undefined2)uVar32 + 1;
      p->nSkip = uVar32._2_2_ + 1;
      p->aLTerm[uVar32 & 0xffff] = (WhereTerm *)0x0;
      pbVar2 = (byte *)((long)&p->wsFlags + 1);
      *pbVar2 = *pbVar2 | 0x80;
      sVar23 = pProbe->aiRowLogEst[uVar25] - pProbe->aiRowLogEst[uVar25 + 1];
      p->nOut = p->nOut - sVar23;
      whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,sVar23 + nInMul + 5);
      p->nOut = LVar8;
      (p->u).btree.nEq = uVar3;
      p->nSkip = uVar3;
      p->wsFlags = uVar9;
      iVar16 = 0;
    }
  }
  return iVar16;
LAB_001a6cb3:
  uVar30 = uVar30 + 1;
  if (uVar30 == local_128) goto code_r0x001a6cc6;
  goto LAB_001a6b8b;
code_r0x001a6cc6:
  uVar30 = (ulong)local_128;
LAB_001a6ed3:
  uVar17 = p->wsFlags;
  if ((uVar13 & 0x24) == 0) {
    uVar32 = uVar17 | 0x12;
    p->wsFlags = uVar32;
    (p->u).btree.nTop = (u16)uVar30;
    local_110 = pWVar18;
    if ((uVar17 & 0x20) != 0) {
      local_130 = p->aLTerm[(ulong)p->nLTerm - 2];
      sVar29 = 0;
      goto LAB_001a6a96;
    }
    uVar13 = p->nOut;
    sVar29 = 0;
    local_130 = (WhereTerm *)0x0;
    uVar27 = uVar13;
  }
  else {
    uVar32 = uVar17 | 0x22;
    p->wsFlags = uVar32;
    (p->u).btree.nBtm = (u16)uVar30;
    local_130 = pWVar18;
    if ((pWVar18->wtFlags & 0x100) == 0) {
      sVar29 = 0;
      local_110 = (WhereTerm *)0x0;
    }
    else {
      iVar16 = whereLoopResize(db,p,p->nLTerm + 1);
      if (iVar16 != 0) {
LAB_001a6fc0:
        iVar16 = 0;
        goto LAB_001a6fc3;
      }
      uVar27 = p->nLTerm;
      p->nLTerm = uVar27 + 1;
      p->aLTerm[uVar27] = pWVar18 + 1;
      uVar32 = p->wsFlags | 0x10;
      p->wsFlags = uVar32;
      (p->u).btree.nTop = 1;
      sVar29 = 0;
      local_110 = pWVar18 + 1;
    }
LAB_001a6a96:
    if ((uVar32 & 2) == 0) {
      uVar17 = (p->u).vtab.idxNum + 1;
      (p->u).btree.nEq = (u16)uVar17;
      if ((pWVar18->truthProb < 1) && (-1 < pProbe->aiColumn[uVar25])) {
        uVar17 = (uint)(ushort)((pWVar18->truthProb - sVar29) + p->nOut);
      }
      else {
        uVar30 = (ulong)(uVar17 & 0xffff);
        uVar27 = (pProbe->aiRowLogEst[uVar30] - pProbe->aiRowLogEst[uVar30 - 1]) + p->nOut;
        uVar17 = uVar27 + 10;
        if ((uVar13 >> 8 & 1) == 0) {
          uVar17 = (uint)uVar27;
        }
      }
      goto LAB_001a6db5;
    }
    uVar13 = p->nOut;
    if (local_130 == (WhereTerm *)0x0) {
      local_130 = (WhereTerm *)0x0;
      uVar27 = uVar13;
    }
    else if (local_130->truthProb < 1) {
      uVar27 = local_130->truthProb + uVar13;
    }
    else {
      uVar27 = uVar13 - 0x14;
      if ((local_130->wtFlags & 0x80) != 0) {
        uVar27 = uVar13;
      }
    }
  }
  uVar15 = uVar27;
  if (local_110 != (WhereTerm *)0x0) {
    if (local_110->truthProb < 1) {
      uVar15 = local_110->truthProb + uVar27;
    }
    else {
      uVar15 = uVar27 - 0x14;
      if ((local_110->wtFlags & 0x80) != 0) {
        uVar15 = uVar27;
      }
    }
  }
  uVar27 = uVar15;
  if ((((local_130 != (WhereTerm *)0x0) && (local_110 != (WhereTerm *)0x0)) &&
      (0 < local_130->truthProb)) && (uVar27 = uVar15 - 0x14, local_110->truthProb < 1)) {
    uVar27 = uVar15;
  }
  uVar17 = (int)(short)uVar13 + (uint)(local_130 == (WhereTerm *)0x0) + -2 +
           (uint)(local_110 == (WhereTerm *)0x0);
  uVar13 = 10;
  if (10 < (short)uVar27) {
    uVar13 = uVar27;
  }
  if ((int)(uint)uVar13 <= (int)uVar17) {
    uVar17 = (uint)uVar13;
  }
LAB_001a6db5:
  sVar31 = (short)uVar17;
  a = sqlite3LogEstAdd((short)local_108,
                       (short)((pProbe->szIdxRow * 0xf) / (int)pSrc->pTab->szTabRow) + sVar31 + 1);
  if ((uVar32 & 0x140) == 0) {
    a = sqlite3LogEstAdd(a,sVar31 + 0x10);
  }
  sVar29 = sVar29 + nInMul;
  p->rRun = a + sVar29;
  p->nOut = sVar31 + sVar29;
  whereLoopOutputAdjust(pBuilder->pWC,p,sVar23);
  iVar16 = whereLoopInsert(pBuilder,p);
  if ((p->wsFlags & 2) != 0) {
    sVar31 = LVar8;
  }
  p->nOut = sVar31;
  if ((((p->wsFlags & 0x10) == 0) && (uVar13 = (p->u).btree.nEq, uVar13 < pProbe->nColumn)) &&
     ((uVar13 < pProbe->nKeyCol || ((*(ushort *)&pProbe->field_0x63 & 3) != 2)))) {
    whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,sVar29);
  }
  p->nOut = LVar8;
LAB_001a6e86:
  pWVar18 = whereScanNext(&local_a0);
  if ((iVar16 != 0) || (pWVar18 == (WhereTerm *)0x0)) goto LAB_001a6fc3;
  goto LAB_001a67e3;
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  SrcItem *pSrc,                  /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyse context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
  WHERETRACE(0x800, ("BEGIN %s.addBtreeIdx(%s), nEq=%d, nSkip=%d, rRun=%d\n",
                     pProbe->pTable->zName,pProbe->zName,
                     pNew->u.btree.nEq, pNew->nSkip, pNew->rRun));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );
  assert( pNew->u.btree.nEq<pProbe->nKeyCol
       || pProbe->idxType!=SQLITE_IDXTYPE_PRIMARYKEY );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    if( (pSrc->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))!=0
     && !constraintCompatibleWithOuterJoin(pTerm,pSrc)
    ){
      continue;
    }
    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags1 |= SQLITE_BLDF1_UNIQUE;
    }else{
      pBuilder->bldFlags1 |= SQLITE_BLDF1_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( pNew->nLTerm>=pNew->nLSlot
     && whereLoopResize(db, pNew, pNew->nLTerm+1)
    ){
       break; /* OOM while trying to enlarge the pNew->aLTerm array */
    }
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      if( ExprUseXSelect(pExpr) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
      }
      if( pProbe->hasStat1 && rLogSize>=10 ){
        LogEst M, logK, x;
        /* Let:
        **   N = the total number of rows in the table
        **   K = the number of entries on the RHS of the IN operator
        **   M = the number of rows in the table that match terms to the
        **       to the left in the same index.  If the IN operator is on
        **       the left-most index column, M==N.
        **
        ** Given the definitions above, it is better to omit the IN operator
        ** from the index lookup and instead do a scan of the M elements,
        ** testing each scanned row against the IN operator separately, if:
        **
        **        M*log(K) < K*log(N)
        **
        ** Our estimates for M, K, and N might be inaccurate, so we build in
        ** a safety margin of 2 (LogEst: 10) that favors using the IN operator
        ** with the index, as using an index has better worst-case behavior.
        ** If we do not have real sqlite_stat1 data, always prefer to use
        ** the index.  Do not bother with this optimization on very small
        ** tables (less than 2 rows) as it is pointless in that case.
        */
        M = pProbe->aiRowLogEst[saved_nEq];
        logK = estLog(nIn);
        /* TUNING      v-----  10 to bias toward indexed IN */
        x = M + logK + 10 - (nIn + rLogSize);
        if( x>=0 ){
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d) "
             "prefers indexed lookup\n",
             saved_nEq, M, logK, nIn, rLogSize, x));
        }else if( nInMul<2 && OptimizationEnabled(db, SQLITE_SeekScan) ){
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d"
             " nInMul=%d) prefers skip-scan\n",
             saved_nEq, M, logK, nIn, rLogSize, x, nInMul));
          pNew->wsFlags |= WHERE_IN_SEEKSCAN;
        }else{
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d"
             " nInMul=%d) prefers normal scan\n",
             saved_nEq, M, logK, nIn, rLogSize, x, nInMul));
          continue;
        }
      }
      pNew->wsFlags |= WHERE_COLUMN_IN;
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID
       || (iCol>=0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol==XN_ROWID || pProbe->uniqNotNull
         || (pProbe->nKeyCol==1 && pProbe->onError && eOp==WO_EQ)
        ){
          pNew->wsFlags |= WHERE_ONEROW;
        }else{
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }
      }
      if( scan.iEquiv>1 ) pNew->wsFlags |= WHERE_TRANSCONS;
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else{
      int nVecLen = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      if( eOp & (WO_GT|WO_GE) ){
        testcase( eOp & WO_GT );
        testcase( eOp & WO_GE );
        pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
        pNew->u.btree.nBtm = nVecLen;
        pBtm = pTerm;
        pTop = 0;
        if( pTerm->wtFlags & TERM_LIKEOPT ){
          /* Range constraints that come from the LIKE optimization are
          ** always used in pairs. */
          pTop = &pTerm[1];
          assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
          assert( pTop->wtFlags & TERM_LIKEOPT );
          assert( pTop->eOperator==WO_LT );
          if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
          pNew->aLTerm[pNew->nLTerm++] = pTop;
          pNew->wsFlags |= WHERE_TOP_LIMIT;
          pNew->u.btree.nTop = 1;
        }
      }else{
        assert( eOp & (WO_LT|WO_LE) );
        testcase( eOp & WO_LT );
        testcase( eOp & WO_LE );
        pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = nVecLen;
        pTop = pTerm;
        pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                       pNew->aLTerm[pNew->nLTerm-2] : 0;
      }
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat4 data. Or, if there is no stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0
         && pProbe->nSample
         && ALWAYS(pNew->u.btree.nEq<=pProbe->nSampleCol)
         && ((eOp & WO_IN)==0 || ExprUseXList(pTerm->pExpr))
         && OptimizationEnabled(db, SQLITE_Stat4)
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( nEq==1
             /* TUNING: Mark terms as "low selectivity" if they seem likely
             ** to be true for half or more of the rows in the table.
             ** See tag-202002240-1 */
             && pNew->nOut+10 > pProbe->aiRowLogEst[0]
            ){
#if WHERETRACE_ENABLED /* 0x01 */
              if( sqlite3WhereTrace & 0x01 ){
                sqlite3DebugPrintf(
                   "STAT4 determines term has low selectivity:\n");
                sqlite3WhereTermPrint(pTerm, 999);
              }
#endif
              pTerm->wtFlags |= TERM_HIGHTRUTH;
              if( pTerm->wtFlags & TERM_HEURTRUTH ){
                /* If the term has previously been used with an assumption of
                ** higher selectivity, then set the flag to rerun the
                ** loop computations. */
                pBuilder->bldFlags2 |= SQLITE_BLDF2_2NDPASS;
              }
            }
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a
            ** "col IS NULL" expression matches twice as many rows
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    assert( pSrc->pTab->szTabRow>0 );
    rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
     && (pNew->u.btree.nEq<pProbe->nKeyCol ||
           pProbe->idxType!=SQLITE_IDXTYPE_PRIMARYKEY)
    ){
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18.
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower.
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && saved_nEq==pNew->nLTerm
   && pProbe->noSkipScan==0
   && pProbe->hasStat1!=0
   && OptimizationEnabled(db, SQLITE_SkipScan)
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END %s.addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->pTable->zName, pProbe->zName, saved_nEq, rc));
  return rc;
}